

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode.c
# Opt level: O0

int WebRtcIsac_EncodeStoredDataUb
              (ISACUBSaveEncDataStruct *ISACSavedEnc_obj,Bitstr *bitStream,int32_t jitterInfo,
              float scale,ISACBandwidth bandwidth)

{
  int16_t iVar1;
  ISACBand local_43c;
  ISACBand band;
  int16_t kAveragePitchGain;
  uint16_t **ppuStack_430;
  int shape_len;
  uint16_t **shape_cdf;
  int16_t imagFFT [240];
  int16_t realFFT [240];
  double lpcGain [6];
  int local_30;
  int err;
  int n;
  ISACBandwidth bandwidth_local;
  float scale_local;
  int32_t jitterInfo_local;
  Bitstr *bitStream_local;
  ISACUBSaveEncDataStruct *ISACSavedEnc_obj_local;
  
  WebRtcIsac_ResetBitstream(bitStream);
  WebRtcIsac_EncodeJitterInfo(jitterInfo,bitStream);
  iVar1 = WebRtcIsac_EncodeBandwidth(bandwidth,bitStream);
  ISACSavedEnc_obj_local._4_4_ = (int)iVar1;
  if (-1 < ISACSavedEnc_obj_local._4_4_) {
    if (bandwidth == isac12kHz) {
      ppuStack_430 = WebRtcIsac_kLpcShapeCdfMatUb12;
      band = 8;
      local_43c = kIsacUpperBand12;
    }
    else {
      ppuStack_430 = WebRtcIsac_kLpcShapeCdfMatUb16;
      band = 0x10;
      local_43c = kIsacUpperBand16;
    }
    WebRtcIsac_EncHistMulti(bitStream,ISACSavedEnc_obj->indexLPCShape,ppuStack_430,band);
    if ((scale <= 0.0) || (1.0 <= scale)) {
      WebRtcIsac_EncHistMulti(bitStream,ISACSavedEnc_obj->lpcGainIndex,WebRtcIsac_kLpcGainCdfMat,6);
      if (bandwidth == isac16kHz) {
        WebRtcIsac_EncHistMulti
                  (bitStream,ISACSavedEnc_obj->lpcGainIndex + 6,WebRtcIsac_kLpcGainCdfMat,6);
      }
      lpcGain[5]._4_4_ =
           WebRtcIsac_EncodeSpec
                     (ISACSavedEnc_obj->realFFT,ISACSavedEnc_obj->imagFFT,0,local_43c,bitStream);
    }
    else {
      for (local_30 = 0; local_30 < 6; local_30 = local_30 + 1) {
        lpcGain[(long)local_30 + -1] = (double)scale * ISACSavedEnc_obj->lpcGain[local_30];
      }
      WebRtcIsac_StoreLpcGainUb((double *)(realFFT + 0xec),bitStream);
      if (bandwidth == isac16kHz) {
        for (local_30 = 0; local_30 < 6; local_30 = local_30 + 1) {
          lpcGain[(long)local_30 + -1] = (double)scale * ISACSavedEnc_obj->lpcGain[local_30 + 6];
        }
        WebRtcIsac_StoreLpcGainUb((double *)(realFFT + 0xec),bitStream);
      }
      for (local_30 = 0; local_30 < 0xf0; local_30 = local_30 + 1) {
        imagFFT[(long)local_30 + 0xec] =
             (int16_t)(int)(scale * (float)(int)ISACSavedEnc_obj->realFFT[local_30] + 0.5);
        imagFFT[(long)local_30 + -4] =
             (int16_t)(int)(scale * (float)(int)ISACSavedEnc_obj->imagFFT[local_30] + 0.5);
      }
      lpcGain[5]._4_4_ =
           WebRtcIsac_EncodeSpec(imagFFT + 0xec,(int16_t *)&shape_cdf,0,local_43c,bitStream);
    }
    if (lpcGain[5]._4_4_ < 0) {
      ISACSavedEnc_obj_local._4_4_ = lpcGain[5]._4_4_;
    }
    else {
      ISACSavedEnc_obj_local._4_4_ = WebRtcIsac_EncTerminate(bitStream);
    }
  }
  return ISACSavedEnc_obj_local._4_4_;
}

Assistant:

int WebRtcIsac_EncodeStoredDataUb(
    const ISACUBSaveEncDataStruct* ISACSavedEnc_obj,
    Bitstr* bitStream,
    int32_t jitterInfo,
    float scale,
    enum ISACBandwidth bandwidth) {
  int n;
  int err;
  double lpcGain[SUBFRAMES];
  int16_t realFFT[FRAMESAMPLES_HALF];
  int16_t imagFFT[FRAMESAMPLES_HALF];
  const uint16_t** shape_cdf;
  int shape_len;
  const int16_t kAveragePitchGain = 0.0;
  enum ISACBand band;
  /* Reset bitstream. */
  WebRtcIsac_ResetBitstream(bitStream);

  /* Encode jitter index. */
  WebRtcIsac_EncodeJitterInfo(jitterInfo, bitStream);

  err = WebRtcIsac_EncodeBandwidth(bandwidth, bitStream);
  if (err < 0) {
    return err;
  }

  /* Encode LPC-shape. */
  if (bandwidth == isac12kHz) {
    shape_cdf = WebRtcIsac_kLpcShapeCdfMatUb12;
    shape_len = UB_LPC_ORDER * UB_LPC_VEC_PER_FRAME;
    band = kIsacUpperBand12;
  } else {
    shape_cdf = WebRtcIsac_kLpcShapeCdfMatUb16;
    shape_len = UB_LPC_ORDER * UB16_LPC_VEC_PER_FRAME;
    band = kIsacUpperBand16;
  }
  WebRtcIsac_EncHistMulti(bitStream, ISACSavedEnc_obj->indexLPCShape,
                          shape_cdf, shape_len);

  if ((scale <= 0.0) || (scale >= 1.0)) {
    /* We only consider scales between zero and one. */
    WebRtcIsac_EncHistMulti(bitStream, ISACSavedEnc_obj->lpcGainIndex,
                            WebRtcIsac_kLpcGainCdfMat, UB_LPC_GAIN_DIM);
    if (bandwidth == isac16kHz) {
      /* Store gain indices of the second half. */
      WebRtcIsac_EncHistMulti(bitStream,
                              &ISACSavedEnc_obj->lpcGainIndex[SUBFRAMES],
                              WebRtcIsac_kLpcGainCdfMat, UB_LPC_GAIN_DIM);
    }
    /* Store FFT coefficients. */
    err = WebRtcIsac_EncodeSpec(ISACSavedEnc_obj->realFFT,
                                ISACSavedEnc_obj->imagFFT, kAveragePitchGain,
                                band, bitStream);
  } else {
    /* Scale LPC gain and FFT coefficients. */
    for (n = 0; n < SUBFRAMES; n++) {
      lpcGain[n] = scale * ISACSavedEnc_obj->lpcGain[n];
    }
    /* Store LPC gains. */
    WebRtcIsac_StoreLpcGainUb(lpcGain, bitStream);

    if (bandwidth == isac16kHz) {
      /* Scale and code the gains of the second half of the frame, if 16kHz. */
      for (n = 0; n < SUBFRAMES; n++) {
        lpcGain[n] = scale * ISACSavedEnc_obj->lpcGain[n + SUBFRAMES];
      }
      WebRtcIsac_StoreLpcGainUb(lpcGain, bitStream);
    }

    for (n = 0; n < FRAMESAMPLES_HALF; n++) {
      realFFT[n] = (int16_t)(scale * (float)ISACSavedEnc_obj->realFFT[n] +
          0.5f);
      imagFFT[n] = (int16_t)(scale * (float)ISACSavedEnc_obj->imagFFT[n] +
          0.5f);
    }
    /* Store FFT coefficients. */
    err = WebRtcIsac_EncodeSpec(realFFT, imagFFT, kAveragePitchGain,
                                band, bitStream);
  }
  if (err < 0) {
    /* Error happened while encoding FFT coefficients. */
    return err;
  }

  /* Complete arithmetic coding. */
  return WebRtcIsac_EncTerminate(bitStream);
}